

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)9,_Protocol::MQTT::Common::DynamicBinaryData>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicBinaryData local_28;
  
  this = (PropertyBase *)operator_new(0x30);
  local_28.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_0011e540;
  local_28.length = 0;
  local_28.data = (uint8 *)0x0;
  Property<Protocol::MQTT::Common::DynamicBinaryData>::Property
            ((Property<Protocol::MQTT::Common::DynamicBinaryData> *)this,CorrelationData,&local_28,
             true);
  free(local_28.data);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }